

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O2

void __thiscall Corrade::Utility::Arguments::parse(Arguments *this,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  Entry *pEVar3;
  bool *pbVar4;
  Debug DStack_58;
  string local_38;
  
  bVar2 = tryParse(this,argc,argv);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DStack_58,
                 &this->_prefix,"help");
  pEVar3 = find(this,(string *)&DStack_58);
  pbVar4 = Containers::Array<bool,_void_(*)(bool_*,_unsigned_long)>::operator[]<unsigned_long,_0>
                     (&this->_booleans,pEVar3->id);
  bVar1 = *pbVar4;
  std::__cxx11::string::~string((string *)&DStack_58);
  if (bVar1 == true) {
    Debug::Debug(&DStack_58,(Flags)0x1);
    help_abi_cxx11_(&local_38,this);
    Utility::operator<<(&DStack_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    Debug::~Debug(&DStack_58);
    exit(0);
  }
  if (bVar2) {
    return;
  }
  Debug::Debug(&DStack_58,(Flags)0x1);
  usage_abi_cxx11_(&local_38,this);
  Utility::operator<<(&DStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  Debug::~Debug(&DStack_58);
  exit(1);
}

Assistant:

void Arguments::parse(const int argc, const char* const* const argv) {
    const bool status = tryParse(argc, argv);

    if(_booleans[find(_prefix + "help")->id]) {
        /* LCOV_EXCL_START */
        Debug{Debug::Flag::NoNewlineAtTheEnd} << help();
        std::exit(0);
        /* LCOV_EXCL_STOP */
    }

    if(!status) {
        /* LCOV_EXCL_START */
        Debug{Debug::Flag::NoNewlineAtTheEnd} << usage();
        std::exit(1);
        /* LCOV_EXCL_STOP */
    }
}